

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::flipnm_post
          (tetgenmesh *this,triface *abtets,int n,int nn,int abedgepivot,flipconstraints *fc)

{
  long *plVar1;
  tetrahedron ppdVar2;
  long lVar3;
  ulong uVar4;
  tetrahedron *pppdVar5;
  ulong uVar6;
  uint uVar7;
  triface *ptVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  triface *ptVar13;
  int *piVar14;
  int *piVar15;
  uint abedgepivot_00;
  ulong uVar16;
  uint uVar17;
  triface *ptVar18;
  uint local_70;
  int local_6c;
  triface local_68;
  tetrahedron *local_58;
  int local_50;
  ulong local_48;
  int local_40;
  
  lVar3 = 8;
  do {
    *(undefined8 *)((long)&local_70 + lVar3) = 0;
    *(undefined4 *)((long)&local_68.tet + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x38);
  local_6c = n;
  if (((nn == 2) && (nn = 3, fc->unflip != 0)) &&
     (flip23(this,abtets,1,fc), fc->collectnewtets != 0)) {
    plVar1 = &this->cavetetlist->objects;
    *plVar1 = *plVar1 + (-1 - (ulong)(abedgepivot == 0));
  }
  if (nn < local_6c) {
    uVar16 = (ulong)nn;
    ptVar18 = abtets + uVar16;
    do {
      uVar17 = abtets[uVar16].ver;
      uVar7 = uVar17 >> 4 & 3;
      iVar10 = (int)uVar16;
      if (uVar7 == 2) {
        ptVar13 = (triface *)abtets[uVar16].tet;
        local_70 = uVar17 >> 0x13;
        uVar7 = uVar17 & 3;
        if (fc->unflip == 0) {
          flipnm_post(this,ptVar13,local_70,2,uVar7,fc);
        }
        else {
          uVar17 = uVar17 >> 6 & 0x1fff;
          uVar4 = (ulong)uVar17;
          if (2 < this->b->verbose) {
            printf("      Recover a %d-to-m flip at e[%d] of f[%d].\n",(ulong)local_70,(ulong)uVar7,
                   uVar4);
          }
          ptVar8 = abtets + (int)(iVar10 + uVar17 + -1) % iVar10;
          if (uVar7 == 1) {
            pppdVar5 = ptVar8->tet;
            ptVar13->tet = pppdVar5;
            iVar9 = ptVar8->ver;
            ptVar13->ver = iVar9;
            iVar9 = eprevtbl[iVar9];
            ptVar13->ver = iVar9;
            iVar9 = esymtbl[iVar9];
            ptVar13->ver = iVar9;
            uVar11 = eprevtbl[iVar9];
            ptVar13->ver = uVar11;
            lVar3 = 0x18;
            ptVar8 = ptVar13 + 1;
            abedgepivot_00 = 1;
          }
          else {
            pppdVar5 = ptVar8->tet;
            ptVar13[1].tet = pppdVar5;
            iVar9 = ptVar8->ver;
            ptVar13[1].ver = iVar9;
            iVar9 = enexttbl[iVar9];
            ptVar13[1].ver = iVar9;
            iVar9 = esymtbl[iVar9];
            ptVar13[1].ver = iVar9;
            uVar11 = enexttbl[iVar9];
            ptVar13[1].ver = uVar11;
            lVar3 = 8;
            ptVar8 = ptVar13;
            abedgepivot_00 = uVar7;
          }
          ppdVar2 = pppdVar5[uVar11 & 3];
          uVar12 = (uint)ppdVar2 & 0xf;
          *(uint *)((long)&ptVar13->tet + lVar3) = uVar12;
          ptVar8->tet = (tetrahedron *)((ulong)ppdVar2 & 0xfffffffffffffff0);
          *(int *)((long)&ptVar13->tet + lVar3) = fsymtbl[(int)uVar11][uVar12];
          flipnm_post(this,ptVar13,local_70,2,abedgepivot_00,fc);
          if ((long)uVar4 < (long)uVar16) {
            uVar6 = uVar16 & 0xffffffff;
            ptVar8 = abtets + uVar6;
            do {
              uVar6 = uVar6 - 1;
              ptVar8->tet = ptVar8[-1].tet;
              ptVar8->ver = ptVar8[-1].ver;
              ptVar8 = ptVar8 + -1;
            } while ((long)uVar4 < (long)uVar6);
          }
          local_68.tet = ptVar13[1].tet;
          piVar14 = eprevtbl;
          piVar15 = enexttbl;
          if (uVar7 == 1) {
            piVar14 = enexttbl;
            piVar15 = eprevtbl;
          }
          local_68.ver = esymtbl[piVar14[ptVar13[1].ver]];
          local_58 = ptVar13->tet;
          local_50 = piVar15[esymtbl[ptVar13->ver]];
          iVar10 = (int)(iVar10 + uVar17) % (iVar10 + 1);
          abtets[iVar10].tet = local_68.tet;
          abtets[iVar10].ver = local_68.ver;
          *(tetrahedron **)((long)&abtets->tet + (ulong)(uVar17 << 4)) = local_58;
          *(int *)((long)&abtets->ver + (ulong)(uVar17 << 4)) = local_50;
        }
        if (2 < this->b->verbose) {
          printf("      Release %d spaces at f[%d].\n",(ulong)local_70,uVar16 & 0xffffffff);
        }
        if (ptVar13 != (triface *)0x0) {
          operator_delete__(ptVar13);
        }
      }
      else if ((uVar7 == 1) && (fc->unflip != 0)) {
        uVar17 = (int)uVar17 >> 6;
        if (2 < this->b->verbose) {
          printf("      Recover a 2-to-3 flip at f[%d].\n",(ulong)uVar17);
        }
        iVar9 = (int)(iVar10 + uVar17 + -1) % iVar10;
        local_68.tet = abtets[iVar9].tet;
        local_68.ver = enexttbl[esymtbl[eprevtbl[abtets[iVar9].ver]]];
        local_58 = (tetrahedron *)
                   ((ulong)local_68.tet[facepivot1[local_68.ver]] & 0xfffffffffffffff0);
        local_50 = facepivot2[local_68.ver][(uint)local_68.tet[facepivot1[local_68.ver]] & 0xf];
        local_48 = (ulong)local_58[facepivot1[local_50]] & 0xfffffffffffffff0;
        local_40 = facepivot2[local_50][(uint)local_58[facepivot1[local_50]] & 0xf];
        flip32(this,&local_68,1,fc);
        lVar3 = (long)(int)uVar17;
        ptVar13 = ptVar18;
        for (uVar4 = uVar16; lVar3 < (long)uVar4; uVar4 = uVar4 - 1) {
          ptVar13->tet = ptVar13[-1].tet;
          ptVar13->ver = ptVar13[-1].ver;
          ptVar13 = ptVar13 + -1;
        }
        iVar10 = (int)(uVar17 + iVar10) % (iVar10 + 1);
        abtets[iVar10].tet = local_58;
        abtets[iVar10].ver = esymtbl[local_50];
        abtets[lVar3].tet = local_68.tet;
        abtets[lVar3].ver = local_68.ver;
        if (fc->collectnewtets != 0) {
          plVar1 = &this->cavetetlist->objects;
          *plVar1 = *plVar1 + -2;
        }
      }
      uVar16 = uVar16 + 1;
      ptVar18 = ptVar18 + 1;
    } while ((int)uVar16 != local_6c);
  }
  return 1;
}

Assistant:

int tetgenmesh::flipnm_post(triface* abtets, int n, int nn, int abedgepivot,
                            flipconstraints* fc)
{
  triface fliptets[3], flipface;
  triface *tmpabtets;
  int fliptype;
  int edgepivot;
  int t, n1;
  int i, j;


  if (nn == 2) {
    // The edge [a,b] has been flipped.
    // 'abtets[0]' is [c,d,e,b] or [#,#,#,b].
    // 'abtets[1]' is [d,c,e,a] or [#,#,#,a].
    if (fc->unflip) {
      // Do a 2-to-3 flip to recover the edge [a,b]. There may be hull tets.
      flip23(abtets, 1, fc);
      if (fc->collectnewtets) {
        // Pop up new (flipped) tets from the stack.
        if (abedgepivot == 0) {
          // Two new tets were collected.
          cavetetlist->objects -= 2;
        } else {
          // Only one of the two new tets was collected.
          cavetetlist->objects -= 1;
        }
      }
    } 
    // The initial size of Star(ab) is 3.
    nn++;
  } 

  // Walk through the performed flips.
  for (i = nn; i < n; i++) {
    // At the beginning of each step 'i', the size of the Star([a,b]) is 'i'.
    // At the end of this step, the size of the Star([a,b]) is 'i+1'.
    // The sizes of the Link([a,b]) are the same.
    fliptype = ((abtets[i].ver >> 4) & 3); // 0, 1, or 2.
    if (fliptype == 1) {
      // It was a 2-to-3 flip: [a,b,c]->[e,d].
      t = (abtets[i].ver >> 6);
      if (fc->unflip) {
        if (b->verbose > 2) {
          printf("      Recover a 2-to-3 flip at f[%d].\n", t);
        }
        // 'abtets[(t-1)%i]' is the tet [a,b,e,d] in current Star(ab), i.e.,
        //   it is created by a 2-to-3 flip [a,b,c] => [e,d].
        fliptets[0] = abtets[((t - 1) + i) % i]; // [a,b,e,d]
        eprevself(fliptets[0]);
        esymself(fliptets[0]);
        enextself(fliptets[0]); // [e,d,a,b]
        fnext(fliptets[0], fliptets[1]); // [e,d,b,c]
        fnext(fliptets[1], fliptets[2]); // [e,d,c,a]
        // Do a 3-to-2 flip: [e,d] => [a,b,c].
        // NOTE: hull tets may be invloved.
        flip32(fliptets, 1, fc);
        // Expand the array 'abtets', maintain the original order.
        // The new array length is (i+1).
        for (j = i - 1; j >= t; j--) {
          abtets[j + 1] = abtets[j];  // Downshift
        }
        // The tet abtets[(t-1)%i] is deleted. Insert the two new tets 
        //   'fliptets[0]' [a,b,c,d] and 'fliptets[1]' [b,a,c,e] into
        //   the (t-1)-th and t-th entries, respectively.
        esym(fliptets[1], abtets[((t-1) + (i+1)) % (i+1)]); // [a,b,e,c]
        abtets[t] = fliptets[0]; // [a,b,c,d]
        if (fc->collectnewtets) {
          // Pop up two (flipped) tets from the stack.
          cavetetlist->objects -= 2;
        }
      } 
    } else if (fliptype == 2) {
      tmpabtets = (triface *) (abtets[i].tet);
      n1 = ((abtets[i].ver >> 19) & 8191); // \sum_{i=0^12}{2^i} = 8191
      edgepivot = (abtets[i].ver & 3); 
      t = ((abtets[i].ver >> 6) & 8191);
      if (fc->unflip) {        
        if (b->verbose > 2) {
          printf("      Recover a %d-to-m flip at e[%d] of f[%d].\n", n1, 
                 edgepivot, t);
        }
        // Recover the flipped edge ([c,b] or [a,c]).
        // abtets[(t - 1 + i) % i] is [a,b,e,d], i.e., the tet created by
        //   the flipping of edge [c,b] or [a,c]. It must still exist in
        //   Star(ab). Use it to recover the flipped edge.
        if (edgepivot == 1) { 
          // The flip edge is [c,b].
          tmpabtets[0] = abtets[(t - 1 + i) % i]; // [a,b,e,d]
          eprevself(tmpabtets[0]);
          esymself(tmpabtets[0]);
          eprevself(tmpabtets[0]); // [d,a,e,b]
          fsym(tmpabtets[0], tmpabtets[1]); // [a,d,e,c]
        } else {
          // The flip edge is [a,c].
          tmpabtets[1] = abtets[(t - 1 + i) % i]; // [a,b,e,d]
          enextself(tmpabtets[1]);
          esymself(tmpabtets[1]);
          enextself(tmpabtets[1]); // [b,d,e,a]
          fsym(tmpabtets[1], tmpabtets[0]); // [d,b,e,c]
        } // if (edgepivot == 2)

        // Do a n1-to-m1 flip to recover the flipped edge ([c,b] or [a,c]).
        flipnm_post(tmpabtets, n1, 2, edgepivot, fc);

        // Insert the two recovered tets into the original Star(ab).
        for (j = i - 1; j >= t; j--) {
          abtets[j + 1] = abtets[j];  // Downshift
        }
        if (edgepivot == 1) {
          // tmpabtets[0] is [c,b,d,a] ==> contains [a,b]
          // tmpabtets[1] is [c,b,a,e] ==> contains [a,b]
          // tmpabtets[2] is [c,b,e,d]
          fliptets[0] = tmpabtets[1];
          enextself(fliptets[0]);
          esymself(fliptets[0]); // [a,b,e,c]
          fliptets[1] = tmpabtets[0];
          esymself(fliptets[1]);
          eprevself(fliptets[1]); // [a,b,c,d]
        } else {
          // tmpabtets[0] is [a,c,d,b] ==> contains [a,b]
          // tmpabtets[1] is [a,c,b,e] ==> contains [a,b]
          // tmpabtets[2] is [a,c,e,d]
          fliptets[0] = tmpabtets[1];
          eprevself(fliptets[0]);
          esymself(fliptets[0]); // [a,b,e,c]
          fliptets[1] = tmpabtets[0];
          esymself(fliptets[1]);
          enextself(fliptets[1]); // [a,b,c,d]
        } // edgepivot == 2
        // Insert the two recovered tets into Star(ab).
        abtets[((t-1) + (i+1)) % (i+1)] = fliptets[0];
        abtets[t] = fliptets[1];
      } 
      else {
        // Only free the spaces.
        flipnm_post(tmpabtets, n1, 2, edgepivot, fc);
      } // if (!unflip)
      if (b->verbose > 2) {
        printf("      Release %d spaces at f[%d].\n", n1, i);
      }
      delete [] tmpabtets;
    }
  } // i

  return 1;
}